

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall GlobOpt::DoLdLenIntSpec(GlobOpt *this,Instr *instr,ValueType baseValueType)

{
  undefined2 other;
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *pJVar5;
  FunctionJITTimeInfo *this_00;
  JITTimeProfileInfo *this_01;
  RegOpnd *pRVar6;
  ValueType local_22 [4];
  ValueType baseValueType_local;
  
  if (instr != (Instr *)0x0) {
    if (instr->m_opcode != LdLen_A) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3eab,"(!instr || instr->m_opcode == Js::OpCode::LdLen_A)",
                         "!instr || instr->m_opcode == Js::OpCode::LdLen_A");
      if (!bVar2) goto LAB_0046351d;
      *puVar4 = 0;
    }
    if (instr->m_dst == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3eac,"(!instr || instr->GetDst())","!instr || instr->GetDst()");
      if (!bVar2) goto LAB_0046351d;
      *puVar4 = 0;
    }
    if (instr->m_src1 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3ead,"(!instr || instr->GetSrc1())","!instr || instr->GetSrc1()");
      if (!bVar2) goto LAB_0046351d;
      *puVar4 = 0;
    }
  }
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar5);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,LdLenIntSpecPhase,sourceContextId,functionId);
  if ((!bVar2) && (bVar2 = IsTypeSpecPhaseOff(this->func), !bVar2)) {
    pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    bVar2 = JITTimeFunctionBody::HasProfileInfo(pJVar5);
    if (bVar2) {
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      this_01 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar5);
      bVar2 = JITTimeProfileInfo::IsLdLenIntSpecDisabled(this_01);
      if (bVar2) {
        return false;
      }
    }
    if (instr != (Instr *)0x0) {
      if ((this->prePassLoop == (Loop *)0x0) && (bVar2 = IR::Instr::DoStackArgsOpt(instr), bVar2)) {
        return false;
      }
      if (instr->m_kind == InstrKindProfiled) {
        bVar2 = ValueType::IsLikelyInt((ValueType *)(instr + 1));
        if (!bVar2) {
          return false;
        }
        pRVar6 = IR::Opnd::AsRegOpnd(instr->m_dst);
        if ((pRVar6->m_sym->field_0x18 & 2) != 0) {
          return false;
        }
      }
      other = instr->m_src1->m_valueType;
      bVar2 = ValueType::operator==(local_22,(ValueType)other);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3ec1,"(!instr || baseValueType == instr->GetSrc1()->GetValueType())",
                           "!instr || baseValueType == instr->GetSrc1()->GetValueType()");
        if (!bVar2) {
LAB_0046351d:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    bVar2 = ValueType::HasBeenString(local_22);
    if (bVar2) {
      return true;
    }
    bVar2 = ValueType::IsLikelyAnyOptimizedArray(local_22);
    if (bVar2) {
      OVar3 = ValueType::GetObjectType(local_22);
      return OVar3 != ObjectWithArray;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoLdLenIntSpec(IR::Instr * const instr, const ValueType baseValueType)
{
    Assert(!instr || instr->m_opcode == Js::OpCode::LdLen_A);
    Assert(!instr || instr->GetDst());
    Assert(!instr || instr->GetSrc1());

    if(PHASE_OFF(Js::LdLenIntSpecPhase, func) ||
        IsTypeSpecPhaseOff(func) ||
        (func->HasProfileInfo() && func->GetReadOnlyProfileInfo()->IsLdLenIntSpecDisabled()) ||
        (instr && !IsLoopPrePass() && instr->DoStackArgsOpt()))
    {
        return false;
    }

    if(instr &&
        instr->IsProfiledInstr() &&
        (
            !instr->AsProfiledInstr()->u.FldInfo().valueType.IsLikelyInt() ||
            instr->GetDst()->AsRegOpnd()->m_sym->m_isNotNumber
        ))
    {
        return false;
    }

    Assert(!instr || baseValueType == instr->GetSrc1()->GetValueType());
    return
        baseValueType.HasBeenString() ||
        (baseValueType.IsLikelyAnyOptimizedArray() && baseValueType.GetObjectType() != ObjectType::ObjectWithArray);
}